

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall soplex::SoPlexBase<double>::_syncLPRational(SoPlexBase<double> *this,bool time)

{
  byte in_SIL;
  long in_RDI;
  SoPlexBase<double> *in_stack_00000020;
  SPxLPBase<double> *in_stack_00000048;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_00000050;
  
  if ((in_SIL & 1) != 0) {
    (**(code **)(**(long **)(*(long *)(in_RDI + 0x20) + 0x20) + 0x18))();
  }
  _ensureRationalLP(in_stack_00000020);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
  ::operator=(in_stack_00000050,in_stack_00000048);
  _recomputeRangeTypesRational(in_stack_00000020);
  if ((in_SIL & 1) != 0) {
    (**(code **)(**(long **)(*(long *)(in_RDI + 0x20) + 0x20) + 0x20))();
  }
  return;
}

Assistant:

void SoPlexBase<R>::_syncLPRational(bool time)
{
   // start timing
   if(time)
      _statistics->syncTime->start();

   // copy LP
   _ensureRationalLP();
   *_rationalLP = *_realLP;
   _recomputeRangeTypesRational();

   // stop timing
   if(time)
      _statistics->syncTime->stop();
}